

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcolumn_bmod.c
# Opt level: O2

int dcolumn_bmod(int jcol,int nseg,double *dense,double *tempv,int *segrep,int *repfnz,int fpanelc,
                GlobalLU_t *Glu,SuperLUStat_t *stat)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int_t iVar5;
  long lVar6;
  ulong uVar7;
  int *piVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  double *pdVar12;
  long lVar13;
  uint nrow;
  int iVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  int_t *piVar18;
  long lVar19;
  uint uVar20;
  int_t *piVar21;
  int iVar22;
  long lVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  int_t nzlumax;
  void *local_c0;
  int local_a4;
  long local_a0;
  int_t *local_98;
  int_t *local_90;
  int_t *local_88;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  long local_70;
  flops_t *local_68;
  int *local_60;
  long local_58;
  long local_50;
  int *local_48;
  int *local_40;
  int *local_38;
  
  local_68 = stat->ops;
  local_60 = Glu->xsup;
  local_40 = Glu->supno;
  piVar18 = Glu->lsub;
  local_90 = Glu->xlsub;
  local_c0 = Glu->lusup;
  piVar21 = Glu->xlusup;
  local_a4 = Glu->nzlumax;
  lVar9 = (long)nseg;
  local_78 = 0;
  if (0 < nseg) {
    local_78 = nseg;
  }
  lVar23 = (long)jcol;
  local_58 = (long)local_40[lVar23];
  local_70 = (long)local_c0 + 8;
  iVar4 = 0;
  local_a0 = lVar23;
  local_98 = piVar21;
  local_88 = piVar18;
  local_80 = local_a4;
  local_7c = jcol;
  local_48 = repfnz;
  local_38 = segrep;
  while (iVar4 != local_78) {
    lVar9 = lVar9 + -1;
    iVar2 = local_38[lVar9];
    local_74 = iVar4;
    if ((int)local_58 != local_40[iVar2]) {
      iVar4 = local_60[local_40[iVar2]];
      iVar22 = fpanelc;
      if (fpanelc < iVar4) {
        iVar22 = iVar4;
      }
      iVar17 = iVar22 - iVar4;
      iVar11 = piVar21[iVar22] + iVar17;
      iVar3 = local_90[iVar4] + iVar17;
      iVar14 = local_48[iVar2];
      if (local_48[iVar2] <= fpanelc) {
        iVar14 = fpanelc;
      }
      uVar20 = (iVar2 - iVar14) + 1;
      uVar16 = iVar2 - iVar22;
      lVar6 = (long)local_90[(long)iVar4 + 1];
      iVar4 = local_90[(long)iVar4 + 1] - local_90[iVar4];
      nrow = (~uVar16 - iVar17) + iVar4;
      local_68[0x13] = (float)(int)((iVar2 - iVar14) * uVar20) + local_68[0x13];
      local_68[0x14] = (float)(int)(nrow * uVar20 * 2) + local_68[0x14];
      lVar19 = (long)(int)(iVar3 + uVar16);
      lVar10 = (long)(int)(uVar16 + 1 + iVar3);
      uVar15 = iVar2 - iVar14;
      piVar18 = local_88;
      piVar21 = local_98;
      lVar23 = local_a0;
      if (uVar15 == 0) {
        dVar26 = dense[local_88[lVar19]];
        pdVar12 = (double *)((long)local_c0 + (long)(int)(iVar11 + uVar16 + 1 + iVar4 * uVar16) * 8)
        ;
        for (; lVar10 < lVar6; lVar10 = lVar10 + 1) {
          dense[local_88[lVar10]] = *pdVar12 * -dVar26 + dense[local_88[lVar10]];
          pdVar12 = pdVar12 + 1;
        }
      }
      else if ((int)uVar15 < 3) {
        iVar2 = local_88[lVar19];
        iVar11 = (iVar4 + 1) * uVar16 + iVar11;
        iVar22 = local_88[lVar19 + -1];
        dVar26 = dense[iVar22];
        lVar13 = (long)(iVar11 - iVar4);
        if (uVar20 == 2) {
          dVar24 = dense[iVar2] - *(double *)((long)local_c0 + lVar13 * 8) * dVar26;
          dense[iVar2] = dVar24;
          for (lVar19 = 0; lVar10 + lVar19 < lVar6; lVar19 = lVar19 + 1) {
            dense[local_88[lVar10 + lVar19]] =
                 dense[local_88[lVar10 + lVar19]] -
                 (*(double *)(local_70 + (long)iVar11 * 8 + lVar19 * 8) * dVar24 +
                 *(double *)(local_70 + lVar13 * 8 + lVar19 * 8) * dVar26);
          }
        }
        else {
          dVar24 = dense[local_88[lVar19 + -2]];
          lVar19 = (long)((iVar11 - iVar4) - iVar4);
          dVar26 = dVar26 - *(double *)((long)local_c0 + lVar19 * 8 + -8) * dVar24;
          dVar25 = (dense[iVar2] - *(double *)((long)local_c0 + lVar13 * 8) * dVar26) -
                   *(double *)((long)local_c0 + lVar19 * 8) * dVar24;
          dense[iVar2] = dVar25;
          dense[iVar22] = dVar26;
          for (lVar19 = 0; lVar10 + lVar19 < lVar6; lVar19 = lVar19 + 1) {
            dense[local_88[lVar10 + lVar19]] =
                 dense[local_88[lVar10 + lVar19]] -
                 (*(double *)(lVar13 * 8 + (long)iVar4 * -8 + local_70 + lVar19 * 8) * dVar24 +
                 *(double *)(local_70 + (long)iVar11 * 8 + lVar19 * 8) * dVar25 +
                 *(double *)(local_70 + lVar13 * 8 + lVar19 * 8) * dVar26);
          }
        }
      }
      else {
        piVar1 = local_88 + (iVar3 + (iVar14 - iVar22));
        for (uVar7 = 0; uVar7 <= uVar15; uVar7 = uVar7 + 1) {
          tempv[uVar7] = dense[piVar1[uVar7]];
        }
        local_50 = (long)((iVar4 + 1) * (iVar14 - iVar22) + iVar11);
        dlsolve(iVar4,uVar20,(double *)((long)local_c0 + local_50 * 8),tempv);
        pdVar12 = tempv + uVar20;
        dmatvec(iVar4,nrow,uVar20,
                (double *)((long)local_c0 + (long)(int)((int)local_50 + uVar20) * 8),tempv,pdVar12);
        piVar8 = piVar1;
        for (uVar7 = 0; uVar7 <= uVar15; uVar7 = uVar7 + 1) {
          dense[piVar1[uVar7]] = tempv[uVar7];
          tempv[uVar7] = 0.0;
          piVar8 = piVar8 + 1;
        }
        if ((int)nrow < 1) {
          nrow = 0;
        }
        for (uVar7 = 0; piVar18 = local_88, piVar21 = local_98, lVar23 = local_a0, nrow != uVar7;
            uVar7 = uVar7 + 1) {
          dense[*piVar8] = dense[*piVar8] - pdVar12[uVar7];
          pdVar12[uVar7] = 0.0;
          piVar8 = piVar8 + 1;
        }
      }
    }
    iVar4 = local_74 + 1;
  }
  iVar4 = piVar21[lVar23];
  iVar2 = local_60[local_58];
  iVar22 = local_90[(long)iVar2 + 1];
  iVar3 = local_90[iVar2];
  iVar14 = local_80;
  while( true ) {
    if ((iVar22 + iVar4) - iVar3 <= iVar14) {
      iVar22 = local_90[(long)iVar2 + 1];
      pdVar12 = (double *)((long)local_c0 + (long)iVar4 * 8);
      for (lVar9 = (long)local_90[iVar2]; lVar9 < iVar22; lVar9 = lVar9 + 1) {
        iVar3 = piVar18[lVar9];
        *pdVar12 = dense[iVar3];
        dense[iVar3] = 0.0;
        iVar4 = iVar4 + 1;
        pdVar12 = pdVar12 + 1;
      }
      if (fpanelc < iVar2) {
        fpanelc = iVar2;
      }
      local_98[local_a0 + 1] = iVar4;
      iVar4 = (int)local_a0;
      iVar22 = iVar4 - fpanelc;
      if (iVar22 != 0 && fpanelc <= iVar4) {
        iVar3 = local_98[fpanelc];
        iVar14 = local_90[(long)iVar2 + 1] - local_90[iVar2];
        uVar20 = (iVar2 - iVar4) + iVar14;
        iVar4 = local_98[local_a0];
        local_68[0x13] = (float)((iVar22 + -1) * iVar22) + local_68[0x13];
        lVar9 = (long)iVar3 + (long)(fpanelc - iVar2);
        lVar23 = (long)iVar4 + (long)(fpanelc - iVar2);
        local_68[0x14] = (float)(int)(iVar22 * uVar20 * 2) + local_68[0x14];
        pdVar12 = (double *)((long)local_c0 + lVar23 * 8);
        dlsolve(iVar14,iVar22,(double *)((long)local_c0 + lVar9 * 8),pdVar12);
        dmatvec(iVar14,uVar20,iVar22,(double *)((long)local_c0 + (long)((int)lVar9 + iVar22) * 8),
                pdVar12,tempv);
        iVar22 = iVar22 + (int)lVar23;
        if ((int)uVar20 < 1) {
          uVar20 = 0;
        }
        for (uVar7 = 0; uVar20 != uVar7; uVar7 = uVar7 + 1) {
          *(double *)((long)local_c0 + uVar7 * 8 + (long)iVar22 * 8) =
               *(double *)((long)local_c0 + uVar7 * 8 + (long)iVar22 * 8) - tempv[uVar7];
          tempv[uVar7] = 0.0;
        }
      }
      return 0;
    }
    iVar5 = dLUMemXpand(local_7c,iVar4,LUSUP,&local_a4,Glu);
    if (iVar5 != 0) break;
    piVar18 = Glu->lsub;
    local_c0 = Glu->lusup;
    iVar14 = local_a4;
  }
  return iVar5;
}

Assistant:

int
dcolumn_bmod (
	     const int  jcol,	  /* in */
	     const int  nseg,	  /* in */
	     double     *dense,	  /* in */
	     double     *tempv,	  /* working array */
	     int        *segrep,  /* in */
	     int        *repfnz,  /* in */
	     int        fpanelc,  /* in -- first column in the current panel */
	     GlobalLU_t *Glu,     /* modified */
	     SuperLUStat_t *stat  /* output */
	     )
{

#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
         ftcs2 = _cptofcd("N", strlen("N")),
         ftcs3 = _cptofcd("U", strlen("U"));
#endif
    int         incx = 1, incy = 1;
    double      alpha, beta;
    
    /* krep = representative of current k-th supernode
     * fsupc = first supernodal column
     * nsupc = no of columns in supernode
     * nsupr = no of rows in supernode (used as leading dimension)
     * luptr = location of supernodal LU-block in storage
     * kfnz = first nonz in the k-th supernodal segment
     * no_zeros = no of leading zeros in a supernodal U-segment
     */
    double      ukj, ukj1, ukj2;
    int_t        luptr, luptr1, luptr2;
    int          fsupc, nsupc, nsupr, segsze;
    int          nrow;	  /* No of rows in the matrix of matrix-vector */
    int          jcolp1, jsupno, k, ksub, krep, krep_ind, ksupno;
    int_t        lptr, kfnz, isub, irow, i;
    int_t        no_zeros, new_next, ufirst, nextlu;
    int          fst_col; /* First column within small LU update */
    int          d_fsupc; /* Distance between the first column of the current
			     panel and the first column of the current snode. */
    int          *xsup, *supno;
    int_t        *lsub, *xlsub;
    double       *lusup;
    int_t        *xlusup;
    int_t        nzlumax;
    double       *tempv1;
    double      zero = 0.0;
    double      one = 1.0;
    double      none = -1.0;
    int_t        mem_error;
    flops_t      *ops = stat->ops;

    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    lusup   = (double *) Glu->lusup;
    xlusup  = Glu->xlusup;
    nzlumax = Glu->nzlumax;
    jcolp1 = jcol + 1;
    jsupno = supno[jcol];
    
    /* 
     * For each nonz supernode segment of U[*,j] in topological order 
     */
    k = nseg - 1;
    for (ksub = 0; ksub < nseg; ksub++) {

	krep = segrep[k];
	k--;
	ksupno = supno[krep];
	if ( jsupno != ksupno ) { /* Outside the rectangular supernode */

	    fsupc = xsup[ksupno];
	    fst_col = SUPERLU_MAX ( fsupc, fpanelc );

  	    /* Distance from the current supernode to the current panel; 
	       d_fsupc=0 if fsupc > fpanelc. */
  	    d_fsupc = fst_col - fsupc; 

	    luptr = xlusup[fst_col] + d_fsupc;
	    lptr = xlsub[fsupc] + d_fsupc;

	    kfnz = repfnz[krep];
	    kfnz = SUPERLU_MAX ( kfnz, fpanelc );

	    segsze = krep - kfnz + 1;
	    nsupc = krep - fst_col + 1;
	    nsupr = xlsub[fsupc+1] - xlsub[fsupc];	/* Leading dimension */
	    nrow = nsupr - d_fsupc - nsupc;
	    krep_ind = lptr + nsupc - 1;

	    ops[TRSV] += segsze * (segsze - 1);
	    ops[GEMV] += 2 * nrow * segsze;


	    /* 
	     * Case 1: Update U-segment of size 1 -- col-col update 
	     */
	    if ( segsze == 1 ) {
	  	ukj = dense[lsub[krep_ind]];
		luptr += nsupr*(nsupc-1) + nsupc;

		for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
		    irow = lsub[i];
		    dense[irow] -=  ukj*lusup[luptr];
		    luptr++;
		}

	    } else if ( segsze <= 3 ) {
		ukj = dense[lsub[krep_ind]];
		luptr += nsupr*(nsupc-1) + nsupc-1;
		ukj1 = dense[lsub[krep_ind - 1]];
		luptr1 = luptr - nsupr;

		if ( segsze == 2 ) { /* Case 2: 2cols-col update */
		    ukj -= ukj1 * lusup[luptr1];
		    dense[lsub[krep_ind]] = ukj;
		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
		    	irow = lsub[i];
		    	luptr++;
		    	luptr1++;
		    	dense[irow] -= ( ukj*lusup[luptr]
					+ ukj1*lusup[luptr1] );
		    }
		} else { /* Case 3: 3cols-col update */
		    ukj2 = dense[lsub[krep_ind - 2]];
		    luptr2 = luptr1 - nsupr;
		    ukj1 -= ukj2 * lusup[luptr2-1];
		    ukj = ukj - ukj1*lusup[luptr1] - ukj2*lusup[luptr2];
		    dense[lsub[krep_ind]] = ukj;
		    dense[lsub[krep_ind-1]] = ukj1;
		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
		    	irow = lsub[i];
		    	luptr++;
		    	luptr1++;
			luptr2++;
		    	dense[irow] -= ( ukj*lusup[luptr]
			     + ukj1*lusup[luptr1] + ukj2*lusup[luptr2] );
		    }
		}



	    } else {
	  	/*
		 * Case: sup-col update
		 * Perform a triangular solve and block update,
		 * then scatter the result of sup-col update to dense
		 */

		no_zeros = kfnz - fst_col;

	        /* Copy U[*,j] segment from dense[*] to tempv[*] */
	        isub = lptr + no_zeros;
	        for (i = 0; i < segsze; i++) {
	  	    irow = lsub[isub];
		    tempv[i] = dense[irow];
		    ++isub; 
	        }

	        /* Dense triangular solve -- start effective triangle */
		luptr += nsupr * no_zeros + no_zeros; 
		
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		STRSV( ftcs1, ftcs2, ftcs3, &segsze, &lusup[luptr], 
		       &nsupr, tempv, &incx );
#else		
		dtrsv_( "L", "N", "U", &segsze, &lusup[luptr], 
		       &nsupr, tempv, &incx );
#endif		
 		luptr += segsze;  /* Dense matrix-vector */
		tempv1 = &tempv[segsze];
                alpha = one;
                beta = zero;
#ifdef _CRAY
		SGEMV( ftcs2, &nrow, &segsze, &alpha, &lusup[luptr], 
		       &nsupr, tempv, &incx, &beta, tempv1, &incy );
#else
		dgemv_( "N", &nrow, &segsze, &alpha, &lusup[luptr], 
		       &nsupr, tempv, &incx, &beta, tempv1, &incy );
#endif
#else
		dlsolve ( nsupr, segsze, &lusup[luptr], tempv );

 		luptr += segsze;  /* Dense matrix-vector */
		tempv1 = &tempv[segsze];
		dmatvec (nsupr, nrow , segsze, &lusup[luptr], tempv, tempv1);
#endif
		
		
                /* Scatter tempv[] into SPA dense[] as a temporary storage */
                isub = lptr + no_zeros;
                for (i = 0; i < segsze; i++) {
                    irow = lsub[isub];
                    dense[irow] = tempv[i];
                    tempv[i] = zero;
                    ++isub;
                }

		/* Scatter tempv1[] into SPA dense[] */
		for (i = 0; i < nrow; i++) {
		    irow = lsub[isub];
		    dense[irow] -= tempv1[i];
		    tempv1[i] = zero;
		    ++isub;
		}
	    }
	    
	} /* if jsupno ... */

    } /* for each segment... */

    /*
     *	Process the supernodal portion of L\U[*,j]
     */
    nextlu = xlusup[jcol];
    fsupc = xsup[jsupno];

    /* Copy the SPA dense into L\U[*,j] */
    new_next = nextlu + xlsub[fsupc+1] - xlsub[fsupc];
    while ( new_next > nzlumax ) {
	mem_error = dLUMemXpand(jcol, nextlu, LUSUP, &nzlumax, Glu);
	if (mem_error) return (mem_error);
	lusup = (double *) Glu->lusup;
	lsub = Glu->lsub;
    }

    for (isub = xlsub[fsupc]; isub < xlsub[fsupc+1]; isub++) {
  	irow = lsub[isub];
	lusup[nextlu] = dense[irow];
        dense[irow] = zero;
	++nextlu;
    }

    xlusup[jcolp1] = nextlu;	/* Close L\U[*,jcol] */

    /* For more updates within the panel (also within the current supernode), 
     * should start from the first column of the panel, or the first column 
     * of the supernode, whichever is bigger. There are 2 cases:
     *    1) fsupc < fpanelc, then fst_col := fpanelc
     *    2) fsupc >= fpanelc, then fst_col := fsupc
     */
    fst_col = SUPERLU_MAX ( fsupc, fpanelc );

    if ( fst_col < jcol ) {

  	/* Distance between the current supernode and the current panel.
	   d_fsupc=0 if fsupc >= fpanelc. */
  	d_fsupc = fst_col - fsupc;

	lptr = xlsub[fsupc] + d_fsupc;
	luptr = xlusup[fst_col] + d_fsupc;
	nsupr = xlsub[fsupc+1] - xlsub[fsupc];	/* Leading dimension */
	nsupc = jcol - fst_col;	/* Excluding jcol */
	nrow = nsupr - d_fsupc - nsupc;

	/* Points to the beginning of jcol in snode L\U(jsupno) */
	ufirst = xlusup[jcol] + d_fsupc;	

	ops[TRSV] += nsupc * (nsupc - 1);
	ops[GEMV] += 2 * nrow * nsupc;
	
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
	STRSV( ftcs1, ftcs2, ftcs3, &nsupc, &lusup[luptr], 
	       &nsupr, &lusup[ufirst], &incx );
#else
	dtrsv_( "L", "N", "U", &nsupc, &lusup[luptr], 
	       &nsupr, &lusup[ufirst], &incx );
#endif
	
	alpha = none; beta = one; /* y := beta*y + alpha*A*x */

#ifdef _CRAY
	SGEMV( ftcs2, &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr,
	       &lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#else
	dgemv_( "N", &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr,
	       &lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#endif
#else
	dlsolve ( nsupr, nsupc, &lusup[luptr], &lusup[ufirst] );

	dmatvec ( nsupr, nrow, nsupc, &lusup[luptr+nsupc],
		&lusup[ufirst], tempv );
	
        /* Copy updates from tempv[*] into lusup[*] */
	isub = ufirst + nsupc;
	for (i = 0; i < nrow; i++) {
	    lusup[isub] -= tempv[i];
	    tempv[i] = 0.0;
	    ++isub;
	}

#endif
	
	
    } /* if fst_col < jcol ... */ 

    return 0;
}